

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx_main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  char **in_RSI;
  int in_EDI;
  Tools cmd;
  iterator it;
  char **in_stack_000006c0;
  int in_stack_000006cc;
  Tools *in_stack_000006d0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**)>_>_>
  *in_stack_ffffffffffffff28;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**)>,_true>
  local_58 [3];
  allocator<char> local_39;
  string local_38 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**)>,_true>
  local_18;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  InitUTF8CLI(&local_8,in_RSI);
  if (1 < local_8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    local_18._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**)>_>_>
         ::find(in_stack_ffffffffffffff28,(key_type *)0x2abd64);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
    local_58[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**)>_>_>
         ::end(in_stack_ffffffffffffff28);
    bVar1 = std::__detail::operator!=(&local_18,local_58);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**)>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**)>,_false,_true>
                             *)0x2abdce);
      iVar2 = (*ppVar3->second)(local_8 + -1,local_10 + 1);
      return iVar2;
    }
  }
  ktx::Tools::Tools((Tools *)&stack0xffffffffffffff58);
  local_4 = ktx::Tools::main(in_stack_000006d0,in_stack_000006cc,in_stack_000006c0);
  ktx::Tools::~Tools((Tools *)0x2abe83);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
    // If -NSDocumentRevisionsDebugMode YES ever causes any problem it should be discarded here
    // by creating a new argc and argv pair and excluding the problematic arguments from them.
    // This way downstream tools will not have to deal with this issue
    //      // -NSDocumentRevisionsDebugMode YES is appended to the end
    //      // of the command by Xcode when debugging and "Allow debugging when
    //      // using document Versions Browser" is checked in the scheme. It
    //      // defaults to checked and is saved in a user-specific file not the
    //      // pbxproj file, so it can't be disabled in a generated project.
    //      // Remove these from the arguments under consideration.

    InitUTF8CLI(argc, argv);

    if (argc >= 2) {
        // Has a subcommand, attempt to lookup

        const auto it = builtinCommands.find(argv[1]);
        if (it != builtinCommands.end()) {
            // Call built-in subcommand, trimming the first parameter.
            return it->second(argc - 1, argv + 1);
        } else {
            // In the future it is possible to add further logic here to allow loading command plugins
            // from shared libraries or call external commands. There is no defined configuration
            // mechanism to do so, but the command framework has been designed to be able to build
            // subcommands as separate executables or shared libraries.
        }
    }

    // If no sub-command was specified or if it was not found, call the main command's entry point.
    ktx::Tools cmd;
    return cmd.main(argc, argv);
}